

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O2

Gia_Man_t * Gia_ManRetimeForward(Gia_Man_t *p,int nMaxIters,int fVerbose)

{
  abctime aVar1;
  Gia_Man_t *pGVar2;
  abctime aVar3;
  int level;
  uint uVar4;
  Gia_Man_t *p_00;
  int nRegMoves;
  int local_38;
  int nRegFixed;
  
  nRegMoves = 1;
  uVar4 = 1;
  p_00 = p;
  local_38 = fVerbose;
  while (((int)(uVar4 - 1) < nMaxIters && (0 < nRegMoves))) {
    aVar1 = Abc_Clock();
    pGVar2 = Gia_ManRetimeForwardOne(p_00,&nRegFixed,&nRegMoves);
    if (local_38 != 0) {
      level = 0x84874f;
      printf("%2d : And = %6d. Reg = %5d. Unret = %5d. Move = %6d. ",(ulong)uVar4,
             (ulong)(uint)(~(p_00->vCos->nSize + p_00->vCis->nSize) + p_00->nObjs),
             (ulong)(uint)p_00->nRegs,(ulong)(uint)nRegFixed,(ulong)(uint)nRegMoves);
      Abc_Print(level,"%s =","Time");
      aVar3 = Abc_Clock();
      Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar1) / 1000000.0);
    }
    if (p_00 != p) {
      Gia_ManStop(p_00);
    }
    uVar4 = uVar4 + 1;
    p_00 = pGVar2;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManRetimeForward( Gia_Man_t * p, int nMaxIters, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    int i, nRegFixed, nRegMoves = 1;
    abctime clk;
    pNew = p;
    for ( i = 0; i < nMaxIters && nRegMoves > 0; i++ )
    {
        clk = Abc_Clock();
        pNew = Gia_ManRetimeForwardOne( pTemp = pNew, &nRegFixed, &nRegMoves );
        if ( fVerbose )
        {
            printf( "%2d : And = %6d. Reg = %5d. Unret = %5d. Move = %6d. ", 
                i + 1, Gia_ManAndNum(pTemp), Gia_ManRegNum(pTemp), nRegFixed, nRegMoves );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( pTemp != p )
            Gia_ManStop( pTemp );
    }
/*
    clk = Abc_Clock();
    pNew = Gia_ManReduceLaches( pNew, fVerbose );
    if ( fVerbose )
    {
        ABC_PRT( "Register sharing time", Abc_Clock() - clk );
    }
*/
    return pNew;
}